

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O1

void __thiscall
Assembler::relocationTableEntry::relocationTableEntry
          (relocationTableEntry *this,int offset,string *typeOfRelocation,int value,string *section)

{
  (this->typeOfRelocation)._M_dataplus._M_p = (pointer)&(this->typeOfRelocation).field_2;
  (this->typeOfRelocation)._M_string_length = 0;
  (this->typeOfRelocation).field_2._M_local_buf[0] = '\0';
  (this->section)._M_dataplus._M_p = (pointer)&(this->section).field_2;
  (this->section)._M_string_length = 0;
  (this->section).field_2._M_local_buf[0] = '\0';
  this->offset = offset;
  std::__cxx11::string::_M_assign((string *)&this->typeOfRelocation);
  this->value = value;
  std::__cxx11::string::_M_assign((string *)&this->section);
  return;
}

Assistant:

relocationTableEntry(int offset = 0, string typeOfRelocation = "", int value = -1, string section = "") {

            this->offset = offset;
            this->typeOfRelocation = typeOfRelocation;
            this->value = value;
            this->section = section;
        }